

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cast.cpp
# Opt level: O2

bool duckdb::StructToStructCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  size_type __n;
  size_type __n_00;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  unsigned_long *puVar2;
  bool bVar3;
  BoundCastData *pBVar4;
  FunctionLocalState *pFVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar6;
  reference pvVar7;
  type pVVar8;
  type pVVar9;
  reference pvVar10;
  reference pvVar11;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  idx_t i_1;
  bool bVar14;
  idx_t i;
  ulong uVar15;
  CastParameters child_parameters;
  
  pBVar4 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  pFVar5 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&parameters->local_state);
  this = StructVector::GetEntries(source);
  this_00 = StructVector::GetEntries(result);
  bVar14 = true;
  for (uVar15 = 0;
      uVar15 < (ulong)((long)pBVar4[8]._vptr_BoundCastData - (long)pBVar4[7]._vptr_BoundCastData >>
                      3); uVar15 = uVar15 + 1) {
    pvVar6 = vector<unsigned_long,_true>::get<true>
                       ((vector<unsigned_long,_true> *)(pBVar4 + 7),uVar15);
    __n = *pvVar6;
    pvVar6 = vector<unsigned_long,_true>::get<true>
                       ((vector<unsigned_long,_true> *)(pBVar4 + 10),uVar15);
    __n_00 = *pvVar6;
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this,__n);
    pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar7);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this_00,__n_00);
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar7);
    pvVar10 = vector<duckdb::BoundCastInfo,_true>::get<true>
                        ((vector<duckdb::BoundCastInfo,_true> *)(pBVar4 + 1),uVar15);
    _Var1._M_head_impl =
         (pvVar10->cast_data).
         super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    pvVar11 = vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
                           *)(pFVar5 + 1),uVar15);
    child_parameters.local_state.ptr =
         (pvVar11->
         super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
         .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
    child_parameters.strict = parameters->strict;
    child_parameters.error_message = parameters->error_message;
    child_parameters.query_location.index = (parameters->query_location).index;
    child_parameters.nullify_parent = false;
    child_parameters.cast_data.ptr = _Var1._M_head_impl;
    bVar3 = (*pvVar10->function)(pVVar8,pVVar9,count,&child_parameters);
    bVar14 = (bool)(bVar14 & bVar3);
  }
  pp_Var13 = pBVar4[0xd]._vptr_BoundCastData;
  pp_Var12 = pBVar4[0xe]._vptr_BoundCastData;
  if (pp_Var13 != pp_Var12) {
    for (uVar15 = 0; uVar15 < (ulong)((long)pp_Var12 - (long)pp_Var13 >> 3); uVar15 = uVar15 + 1) {
      pvVar6 = vector<unsigned_long,_true>::get<true>
                         ((vector<unsigned_long,_true> *)(pBVar4 + 0xd),uVar15);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(this_00,*pvVar6);
      pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar7);
      Vector::SetVectorType(pVVar8,CONSTANT_VECTOR);
      ConstantVector::SetNull(pVVar8,true);
      pp_Var13 = pBVar4[0xd]._vptr_BoundCastData;
      pp_Var12 = pBVar4[0xe]._vptr_BoundCastData;
    }
  }
  if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = (*puVar2 & 1) == 0;
    }
    ConstantVector::SetNull(result,bVar3);
  }
  else {
    Vector::Flatten(source,count);
    FlatVector::VerifyFlatVector(result);
    FlatVector::VerifyFlatVector(source);
    TemplatedValidityMask<unsigned_long>::operator=
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
               &(source->validity).super_TemplatedValidityMask<unsigned_long>);
    Vector::Verify(result,count);
  }
  return bVar14;
}

Assistant:

static bool StructToStructCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	auto &l_state = parameters.local_state->Cast<StructCastLocalState>();

	auto &source_vectors = StructVector::GetEntries(source);
	auto &target_children = StructVector::GetEntries(result);

	bool all_converted = true;
	for (idx_t i = 0; i < cast_data.source_indexes.size(); i++) {
		auto source_idx = cast_data.source_indexes[i];
		auto target_idx = cast_data.target_indexes[i];

		auto &source_vector = *source_vectors[source_idx];
		auto &target_vector = *target_children[target_idx];

		auto &child_cast_info = cast_data.child_cast_info[i];
		CastParameters child_parameters(parameters, child_cast_info.cast_data, l_state.local_states[i]);
		auto success = child_cast_info.function(source_vector, target_vector, count, child_parameters);
		if (!success) {
			all_converted = false;
		}
	}

	if (!cast_data.target_null_indexes.empty()) {
		for (idx_t i = 0; i < cast_data.target_null_indexes.size(); i++) {
			auto target_idx = cast_data.target_null_indexes[i];
			auto &target_vector = *target_children[target_idx];

			target_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(target_vector, true);
		}
	}

	if (source.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, ConstantVector::IsNull(source));
		return all_converted;
	}

	source.Flatten(count);
	auto &result_validity = FlatVector::Validity(result);
	result_validity = FlatVector::Validity(source);
	result.Verify(count);
	return all_converted;
}